

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O2

void __thiscall pg::TLQSolver::~TLQSolver(TLQSolver *this)

{
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLQSolver_001a9c28;
  bitset::~bitset(&this->W1);
  bitset::~bitset(&this->W0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->heads).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->Ps).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~_Vector_base
            (&(this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>);
  std::_Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~_Vector_base
            (&(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>);
  bitset::~bitset(&this->S);
  bitset::~bitset(&this->G);
  uintqueue::~uintqueue(&this->Q);
  bitset::~bitset(&this->escapes);
  uintqueue::~uintqueue(&this->tangleto);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tangle).super__Vector_base<int,_std::allocator<int>_>);
  bitset::~bitset(&this->pea_root);
  uintqueue::~uintqueue(&this->pea_S);
  uintqueue::~uintqueue(&this->pea_state);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tpr).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            (&(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            (&(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>);
  return;
}

Assistant:

TLQSolver::~TLQSolver()
{
}